

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O2

bool __thiscall cmCTestVC::WriteXMLUpdates(cmCTestVC *this,cmXMLWriter *param_1)

{
  cmCTest *this_00;
  char *local_1a8 [4];
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::operator<<((ostream *)&cmCTestLog_msg,"* CTest cannot extract updates for this VCS tool.\n");
  this_00 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestVC.cxx"
               ,0xcb,local_1a8[0],false);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  return true;
}

Assistant:

bool cmCTestVC::WriteXMLUpdates(cmXMLWriter& /*unused*/)
{
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
             "* CTest cannot extract updates for this VCS tool.\n");
  return true;
}